

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

void __thiscall OpenSSLWrapper::SslConnection::SslConnection(SslConnection *this,SslContext *ctx)

{
  SSL_CTX *ctx_00;
  SSL *pSVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  SslContext *ctx_local;
  SslConnection *this_local;
  
  ctx_00 = (SSL_CTX *)SslContext::operator()(ctx);
  pSVar1 = SSL_new(ctx_00);
  this->m_ssl = (SSL *)pSVar1;
  this->m_iShutDownFlag = -0x80000000;
  this->m_bZeroReceived = false;
  std::function<void_()>::function(&this->m_fError);
  this->m_iWantState = 0;
  std::mutex::mutex(&this->m_mxSsl);
  pBVar2 = BIO_s_mem();
  pBVar3 = BIO_new(pBVar2);
  this->m_rbio = (BIO *)pBVar3;
  pBVar2 = BIO_s_mem();
  pBVar3 = BIO_new(pBVar2);
  this->m_wbio = (BIO *)pBVar3;
  BIO_ctrl((BIO *)this->m_rbio,0x82,-1,(void *)0x0);
  BIO_ctrl((BIO *)this->m_wbio,0x82,-1,(void *)0x0);
  BIO_ctrl((BIO *)this->m_rbio,0x66,1,(void *)0x0);
  BIO_ctrl((BIO *)this->m_wbio,0x66,1,(void *)0x0);
  SSL_set_bio((SSL *)this->m_ssl,(BIO *)this->m_wbio,(BIO *)this->m_rbio);
  return;
}

Assistant:

SslConnection::SslConnection(SslContext& ctx) : m_ssl(SSL_new(ctx())), m_iShutDownFlag(INT32_MIN), m_bZeroReceived(false), m_iWantState(0)
    {
        m_rbio = BIO_new(BIO_s_mem());
        m_wbio = BIO_new(BIO_s_mem());
        BIO_set_mem_eof_return(m_rbio, -1);
        BIO_set_mem_eof_return(m_wbio, -1);
        BIO_set_nbio(m_rbio, 1);    // make the bio non blocking
        BIO_set_nbio(m_wbio, 1);    // make the bio non blocking
        SSL_set_bio(m_ssl, m_wbio, m_rbio);

        //BIO_set_callback_arg(m_rbio, (char*)this);
        //BIO_set_callback_arg(m_wbio, (char*)this);
        //BIO_set_callback(m_rbio, CbBioInfo);
        //BIO_set_callback(m_wbio, CbBioInfo);
    }